

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int isViableStructurePos(int structureType,Generator *g,int x,int z,uint32_t flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t biomeID;
  Pos PVar5;
  Layer *pLVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int regX;
  int iVar13;
  Layer *pLVar14;
  uint uVar15;
  uint z_00;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int regZ;
  int iVar19;
  int iVar20;
  byte bVar21;
  bool bVar22;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_01;
  float fVar23;
  StructureConfig config;
  StructureVariant sv_1;
  Layer *local_e8;
  int data [2];
  Layer lbiome;
  Layer lshore;
  float extraout_XMM0_Da_00;
  
  bVar21 = 0;
  iVar20 = x >> 4;
  iVar19 = z >> 4;
  uVar15 = g->dim;
  if (uVar15 == 1) {
    if (structureType == 0x15) {
      if (g->mc < 0x10) {
        return 0;
      }
    }
    else {
      if (structureType != 0x14) {
        return 0;
      }
      if (g->mc < 0xc) {
        return 0;
      }
    }
    iVar19 = getBiomeAt(g,0x10,iVar20,0,iVar19);
    iVar20 = isViableFeatureBiome(g->mc,structureType,iVar19);
    if (iVar20 != 0) {
      return iVar19;
    }
    return 0;
  }
  lVar17 = (long)iVar20;
  lVar12 = (long)iVar19;
  if (uVar15 == 0xffffffff) {
    uVar15 = g->mc;
    if (structureType == 0x12) {
      if (0x15 < (int)uVar15) {
        lbiome.getMap._0_4_ = x / 0x1b0 - (uint)(x % 0x1b0 != 0 && x < 0);
        lbiome.getMap._4_4_ = z / 0x1b0 - (uint)(z % 0x1b0 != 0 && z < 0);
        iVar19 = getStructurePos(0x13,uVar15,g->seed,(int)lbiome.getMap,lbiome.getMap._4_4_,
                                 (Pos *)&lbiome);
        if (iVar19 != 0) {
          iVar19 = isViableStructurePos(0x13,g,x,z,flags);
          return (uint)(iVar19 == 0);
        }
      }
    }
    else {
      if ((int)uVar15 < 0x13) {
        return 0;
      }
      if (structureType != 0xc) {
        if (structureType == 0x13 && 0x15 < uVar15) {
          getVariant((StructureVariant *)&lbiome,0x13,uVar15,g->seed,x,z,-1);
          iVar20 = (int)((ulong)(((long)lbiome.scale._2_2_ + lVar17 * 0x20 +
                                  (long)(short)lbiome._8_2_ * 2 + -1) / 2) >> 2);
          iVar19 = (int)((ulong)(((long)lbiome.layerSalt._2_2_ + lVar12 * 0x20 +
                                  (long)(short)lbiome.scale * 2 + -1) / 2) >> 2);
          iVar7 = (uint)(0x16 < g->mc) << 3;
        }
        else {
          iVar20 = iVar20 * 4 + 2;
          iVar19 = iVar19 * 4 + 2;
          iVar7 = 0;
        }
        iVar19 = getBiomeAt(g,4,iVar20,iVar7,iVar19);
        iVar19 = isViableFeatureBiome(g->mc,structureType,iVar19);
        return iVar19;
      }
    }
    return 1;
  }
  iVar7 = g->mc;
  biomeID = 0;
  if (iVar7 < 0x16) {
    lVar10 = 9;
    pLVar6 = (g->field_5).field_0.ls.layers + 0x15;
    pLVar14 = &lbiome;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      pLVar14->getMap = pLVar6->getMap;
      pLVar6 = (Layer *)&pLVar6->mc;
      pLVar14 = (Layer *)&pLVar14->mc;
    }
    pLVar6 = (g->field_5).field_0.ls.layers + 0x22;
    pLVar14 = &lshore;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      pLVar14->getMap = pLVar6->getMap;
      pLVar6 = (Layer *)&pLVar6->mc;
      pLVar14 = (Layer *)&pLVar14->mc;
    }
    local_e8 = (g->field_5).field_0.entry;
    (g->field_5).field_0.ls.layers[0x15].data = data;
    (g->field_5).field_0.ls.layers[0x15].getMap = mapViableBiome;
    (g->field_5).field_0.ls.layers[0x22].data = data;
    (g->field_5).field_0.ls.layers[0x22].getMap = mapViableShore;
  }
  else {
    local_e8 = (Layer *)0x0;
  }
  data[0] = structureType;
  data[1] = iVar7;
  if (0x17 < structureType - 1U) {
switchD_00108d9b_caseD_12:
    fprintf(_stderr,"isViableStructurePos: bad structure type %d or dimension %d\n",
            (ulong)(uint)structureType,(ulong)uVar15);
LAB_001096fd:
    iVar20 = 0;
    goto LAB_0010943d;
  }
  uVar16 = x >> 2;
  z_00 = z >> 2;
  switch(structureType) {
  case 1:
  case 2:
  case 3:
    break;
  case 4:
    if (iVar7 < 0xc) goto LAB_001092a1;
    break;
  case 5:
    if (0x15 < iVar7) {
      for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 4) {
        biomeID = *(uint32_t *)((long)&DAT_00125a70 + lVar10);
        if ((flags == 0) || (biomeID = flags, *(uint32_t *)((long)&DAT_00125a70 + lVar10) == flags))
        {
          getVariant(&sv_1,5,g->mc,g->seed,x,z,biomeID);
          uVar4 = getBiomeAt(g,0,(int)((ulong)(((long)sv_1.sx + lVar17 * 0x20 + -1 +
                                               (long)sv_1.x * 2) / 2) >> 2),0x4f,
                             (int)((ulong)(((long)sv_1.sz + lVar12 * 0x20 + -1 + (long)sv_1.z * 2) /
                                          2) >> 2));
          if ((uVar4 == biomeID) || ((lVar10 == 0 && (uVar4 == 0xb1))))
          goto switchD_00108d9b_caseD_f;
        }
      }
      goto LAB_001092a1;
    }
    if (iVar7 == 0x12) {
      pLVar6 = (Layer *)((long)&g->field_5 + 0xfc0);
      uVar15 = x & 0xfffffff0U | 9;
      uVar16 = z & 0xfffffff0U | 9;
    }
    else {
      pLVar6 = (Layer *)((long)&g->field_5 + 0xd38);
      uVar15 = iVar20 * 4 + 2;
      uVar16 = iVar19 * 4 + 2;
    }
    (g->field_5).field_0.entry = pLVar6;
    biomeID = getBiomeAt(g,0,uVar15,0,uVar16);
    if ((int)biomeID < 0) {
      iVar20 = 0;
    }
    else {
      iVar19 = isViableFeatureBiome(g->mc,5,biomeID);
      if (iVar19 == 0) goto LAB_001096fd;
      iVar20 = 0;
      if ((flags == 0) || (biomeID == flags)) {
        if (g->mc < 0xd) {
          iVar20 = 0;
          biomeID = getBiomeAt(g,1,x & 0xfffffff0U | 2,0,z & 0xfffffff0U | 2);
          if (((int)biomeID < 0) || (iVar19 = isViableFeatureBiome(g->mc,5,biomeID), iVar19 == 0))
          goto LAB_0010943d;
        }
        goto switchD_00108d9b_caseD_f;
      }
    }
    goto LAB_0010943d;
  case 6:
  case 7:
  case 0xe:
    if (iVar7 < 0x10) goto LAB_001092a1;
    break;
  case 8:
    if (iVar7 < 0xb) goto LAB_001092a1;
    if (iVar7 == 0xb) {
      iVar19 = getBiomeAt(g,1,x & 0xfffffff0U | 8,0,z & 0xfffffff0U | 8);
      if (-1 < iVar19) {
        iVar19 = isDeepOcean(iVar19);
LAB_00109595:
        iVar20 = 0;
        if (iVar19 == 0) goto LAB_0010943d;
LAB_001095a0:
        uVar15 = x & 0xfffffff0U | 8;
        uVar16 = z & 0xfffffff0U | 8;
        if (g->mc - 0xcU < 10) {
          iVar19 = areBiomesViable(g,uVar15,0x3f,uVar16,0x10,0x7800001000000,0,0);
LAB_00109692:
          iVar20 = 0;
          if (iVar19 == 0) goto LAB_0010943d;
        }
        else if (0x15 < g->mc) {
          iVar19 = getBiomeAt(g,4,(int)uVar15 >> 2,9,(int)uVar16 >> 2);
          iVar19 = isDeepOcean(iVar19);
          goto LAB_00109692;
        }
        iVar19 = areBiomesViable(g,uVar15,0x3f,uVar16,0x1d,0x7f00001000c81,0,0);
        goto LAB_0010916c;
      }
    }
    else {
      if (0x15 < iVar7) goto LAB_001095a0;
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0x990);
      iVar19 = getBiomeAt(g,0,iVar20,0,iVar19);
      if (-1 < iVar19) {
        iVar19 = isDeepOcean(iVar19);
        goto LAB_00109595;
      }
    }
    goto LAB_001096fd;
  case 9:
    if (iVar7 < 0xe) goto LAB_001092a1;
    if (iVar7 < 0x16) {
      iVar19 = areBiomesViable(g,x & 0xfffffff0U | 8,0,z & 0xfffffff0U | 8,0x20,0x20000000,
                               0x20000000,0);
      goto LAB_0010916c;
    }
    uVar15 = getBiomeAt(g,4,(uVar16 & 0xfffffffc) + 1,0x4f,(z_00 & 0xfffffffc) + 1);
    iVar20 = 0;
    if ((int)uVar15 < 0) goto LAB_0010943d;
    iVar19 = g->mc;
    iVar20 = 0;
    if (0xd < iVar19) {
      biomeID = 0;
      iVar20 = 0;
      if ((uVar15 & 0x7fffff7f) == 0x1d) goto switchD_00108d9b_caseD_f;
      goto LAB_0010943f;
    }
    goto LAB_00109444;
  case 10:
    if (0x10 < iVar7) {
      sv_1._0_8_ = g->seed;
      setAttemptSeed((uint64_t *)&sv_1,iVar20,iVar19);
      iVar3 = nextInt((uint64_t *)&sv_1,5);
      if (iVar3 == 0) {
        uVar18 = (ulong)(0x15 < iVar7);
        iVar3 = iVar20 + -10;
        iVar13 = (uint)(0x15 < iVar7) * 2 + 0x20;
        iVar7 = iVar20 + 10;
        iVar1 = iVar19 + -10;
        iVar2 = iVar19 + 10;
        uVar18 = uVar18 << 0x21 | uVar18 << 0x29 | 0x51820009e7f70;
        fVar23 = extraout_XMM0_Da;
        for (regZ = iVar1 / iVar13 - (uint)(iVar1 % iVar13 != 0 && iVar19 < 10);
            regX = iVar3 / iVar13 - (uint)(iVar3 % iVar13 != 0 && iVar20 < 10),
            regZ <= (int)(iVar2 / iVar13 - (uint)(iVar2 % iVar13 != 0 && iVar19 < -10));
            regZ = regZ + 1) {
          for (; regX <= (int)(iVar7 / iVar13 - (uint)(iVar7 % iVar13 != 0 && iVar20 < -10));
              regX = regX + 1) {
            config.rarity = fVar23;
            config.salt = (int)uVar18;
            config.regionSize = (char)(uVar18 >> 0x20);
            config.chunkRange = (char)(uVar18 >> 0x28);
            config.structType = (char)(uVar18 >> 0x30);
            config.dim = (char)(uVar18 >> 0x38);
            PVar5 = getFeaturePos(config,g->seed,regX,regZ);
            iVar8 = PVar5.x >> 4;
            iVar11 = PVar5.z >> 4;
            fVar23 = extraout_XMM0_Da_00;
            if (((iVar11 <= iVar2 && iVar8 <= iVar7) && (iVar1 <= iVar11 && iVar3 <= iVar8)) &&
               ((0x12 < g->mc ||
                (iVar8 = isViableStructurePos(5,g,PVar5.x,PVar5.z,0), fVar23 = extraout_XMM0_Da_01,
                iVar8 != 0)))) goto LAB_001092a1;
          }
        }
        if (g->mc < 0x16) {
          if (g->mc < 0x13) {
            (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
            uVar15 = x & 0xfffffff0U | 9;
            uVar16 = z & 0xfffffff0U | 9;
          }
          else {
            (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
            uVar15 = iVar20 * 4 + 2;
            uVar16 = iVar19 * 4 + 2;
          }
        }
        else {
          sv_1._0_8_ = chunkGenerateRnd(g->seed,iVar20,iVar19);
          uVar16 = nextInt((uint64_t *)&sv_1,4);
          if (3 < uVar16) {
            return 0;
          }
          uVar15 = (uint)((ulong)((lVar17 * 0x20 + *(long *)(&DAT_00126fb8 + (ulong)uVar16 * 8)) / 2
                                 ) >> 2);
          uVar16 = (uint)((ulong)((lVar12 * 0x20 + *(long *)(&DAT_00126f98 + (ulong)uVar16 * 8)) / 2
                                 ) >> 2);
        }
        iVar19 = getBiomeAt(g,0,uVar15,0x4f,uVar16);
        if ((-1 < iVar19) && (iVar19 = isViableFeatureBiome(g->mc,10,iVar19), iVar19 != 0)) {
          biomeID = 0;
          goto switchD_00108d9b_caseD_f;
        }
      }
    }
    goto LAB_001092a1;
  case 0xb:
  case 0xc:
    bVar22 = SBORROW4(iVar7,0x13);
    iVar19 = -0x13;
    goto LAB_00109288;
  case 0xd:
    if (0x16 < iVar7) {
LAB_001091db:
      getVariant(&sv_1,structureType,iVar7,g->seed,x,z,-1);
      iVar19 = getBiomeAt(g,4,(int)((ulong)(((long)sv_1.sx + lVar17 * 0x20 + (long)sv_1.x * 2 + -1)
                                           / 2) >> 2),(int)sv_1.y >> 2,
                          (int)((ulong)(((long)sv_1.sz + lVar12 * 0x20 + (long)sv_1.z * 2 + -1) / 2)
                               >> 2));
      if (-1 < iVar19) {
        iVar19 = isViableFeatureBiome(g->mc,structureType,iVar19);
        goto LAB_0010916c;
      }
      iVar20 = 0;
      goto LAB_0010943d;
    }
    goto LAB_001092a1;
  case 0xf:
    goto switchD_00108d9b_caseD_f;
  case 0x10:
    if (iVar7 < 0x13) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
      uVar16 = x;
      z_00 = z;
    }
    else if (iVar7 < 0x16) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
    }
    biomeID = 0;
    iVar19 = getBiomeAt(g,0,uVar16,0x4f,z_00);
    iVar20 = 0;
    if (iVar19 != 2) goto LAB_0010943d;
    goto switchD_00108d9b_caseD_f;
  case 0x11:
    bVar22 = SBORROW4(iVar7,0x15);
    iVar19 = -0x15;
LAB_00109288:
    biomeID = 0;
    iVar20 = 0;
    if (bVar22 == iVar7 + iVar19 < 0) goto switchD_00108d9b_caseD_f;
    goto LAB_0010943d;
  default:
    goto switchD_00108d9b_caseD_12;
  case 0x17:
    if (iVar7 < 0x19) goto LAB_001092a1;
    goto LAB_00109126;
  case 0x18:
    if (0x19 < iVar7) goto LAB_001091db;
LAB_001092a1:
    iVar20 = 0;
    goto LAB_0010943d;
  }
  if (iVar7 < 0x13) {
    (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
    uVar15 = x & 0xfffffff0U | 9;
    uVar16 = z & 0xfffffff0U | 9;
  }
  else {
    if (iVar7 < 0x16) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
    }
LAB_00109126:
    uVar15 = iVar20 * 4 + 2;
    uVar16 = iVar19 * 4 + 2;
  }
  iVar20 = 0;
  iVar19 = getBiomeAt(g,0,uVar15,0x4f,uVar16);
  if (-1 < iVar19) {
    iVar19 = isViableFeatureBiome(g->mc,structureType,iVar19);
LAB_0010916c:
    biomeID = 0;
    iVar20 = 0;
    if (iVar19 != 0) {
switchD_00108d9b_caseD_f:
      iVar20 = biomeID + (biomeID == 0);
    }
  }
LAB_0010943d:
  iVar19 = g->mc;
LAB_0010943f:
  if (iVar19 < 0x16) {
LAB_00109444:
    lVar12 = 9;
    pLVar6 = &lbiome;
    pLVar14 = (g->field_5).field_0.ls.layers + 0x15;
    for (lVar17 = lVar12; lVar17 != 0; lVar17 = lVar17 + -1) {
      pLVar14->getMap = pLVar6->getMap;
      pLVar6 = (Layer *)((long)pLVar6 + (ulong)bVar21 * -0x10 + 8);
      pLVar14 = (Layer *)((long)pLVar14 + ((ulong)bVar21 * -2 + 1) * 8);
    }
    pLVar6 = &lshore;
    pLVar14 = (g->field_5).field_0.ls.layers + 0x22;
    for (; lVar12 != 0; lVar12 = lVar12 + -1) {
      pLVar14->getMap = pLVar6->getMap;
      pLVar6 = (Layer *)((long)pLVar6 + (ulong)bVar21 * -0x10 + 8);
      pLVar14 = (Layer *)((long)pLVar14 + ((ulong)bVar21 * -2 + 1) * 8);
    }
    (g->field_5).field_0.entry = local_e8;
  }
  return iVar20;
}

Assistant:

int isViableStructurePos(int structureType, Generator *g, int x, int z, uint32_t flags)
{
    int approx = 0; // enables approximation levels
    int viable = 0;

    int64_t chunkX = x >> 4;
    int64_t chunkZ = z >> 4;

    // Structures are positioned at the chunk origin, but the biome check is
    // performed near the middle of the chunk [(9,9) in 1.13, TODO: check 1.7]
    // In 1.16 the biome check is always performed at (2,2) with layer scale=4.
    int sampleX, sampleZ, sampleY;
    int id;


    if (g->dim == DIM_NETHER)
    {
        if (structureType == Fortress && g->mc <= MC_1_17)
            return 1;
        if (g->mc <= MC_1_15)
            return 0;
        if (structureType == Ruined_Portal_N)
            return 1;
        if (structureType == Fortress)
        {   // in 1.18+ fortresses generate everywhere, where bastions don't
            StructureConfig sc;
            if (!getStructureConfig(Fortress, g->mc, &sc))
                return 0;
            Pos rp = {
                floordiv(x, sc.regionSize << 4),
                floordiv(z, sc.regionSize << 4)
            };
            if (!getStructurePos(Bastion, g->mc, g->seed, rp.x, rp.z, &rp))
                return 1;
            return !isViableStructurePos(Bastion, g, x, z, flags);
        }
        sampleY = 0;
        if (g->mc >= MC_1_18 && structureType == Bastion)
        {
            StructureVariant sv;
            getVariant(&sv, Bastion, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
            if (g->mc >= MC_1_19_2)
                sampleY = 33 >> 2; // nether biomes don't actually vary in Y
        }
        else
        {
            sampleX = (chunkX * 4) + 2;
            sampleZ = (chunkZ * 4) + 2;
        }
        id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        return isViableFeatureBiome(g->mc, structureType, id);
    }
    else if (g->dim == DIM_END)
    {
        switch (structureType)
        {
        case End_City:
            if (g->mc <= MC_1_8) return 0;
            break;
        case End_Gateway:
            if (g->mc <= MC_1_12) return 0;
            break;
        default:
            return 0;
        }
        // End biomes vary only on a per-chunk scale (1:16)
        // voronoi pre-1.15 shouldn't matter for End Cities as the check will
        // be near the chunk center
        id = getBiomeAt(g, 16, chunkX, 0, chunkZ);
        return isViableFeatureBiome(g->mc, structureType, id) ? id : 0;
    }

    // Overworld

    Layer lbiome, lshore, *entry = 0;
    int data[2] = { structureType, g->mc };

    if (g->mc <= MC_1_17)
    {
        lbiome = g->ls.layers[L_BIOME_256];
        lshore = g->ls.layers[L_SHORE_16];
        entry = g->entry;

        g->ls.layers[L_BIOME_256].data = (void*) data;
        g->ls.layers[L_BIOME_256].getMap = mapViableBiome;
        g->ls.layers[L_SHORE_16].data = (void*) data;
        g->ls.layers[L_SHORE_16].getMap = mapViableShore;
    }

    switch (structureType)
    {
    case Trail_Ruins:
        if (g->mc <= MC_1_19) goto L_not_viable;
        goto L_feature;
    case Ocean_Ruin:
    case Shipwreck:
    case Treasure:
        if (g->mc <= MC_1_12) goto L_not_viable;
        goto L_feature;
    case Igloo:
        if (g->mc <= MC_1_8) goto L_not_viable;
        goto L_feature;
    case Desert_Pyramid:
    case Jungle_Pyramid:
    case Swamp_Hut:
L_feature:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Desert_Well:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = x;
            sampleZ = z;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = x >> 2;
            sampleZ = z >> 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Village:
        if (g->mc <= MC_1_17)
        {
            if (g->mc == MC_1_15)
            {   // exclusively in MC_1_15, villages used the same biome check
                // as other structures
                g->entry = &g->ls.layers[L_VORONOI_1];
                sampleX = chunkX * 16 + 9;
                sampleZ = chunkZ * 16 + 9;
            }
            else
            {
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
                sampleX = chunkX * 4 + 2;
                sampleZ = chunkZ * 4 + 2;
            }
            id = getBiomeAt(g, 0, sampleX, 0, sampleZ);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
            if (flags && (uint32_t) id != flags)
                goto L_not_viable;
            if (g->mc <= MC_1_9)
            {   // before MC_1_10 villages did not spread into invalid biomes,
                // which could cause them to fail to generate on the first
                // check at block (2, 2) in the starting chunk
                sampleX = chunkX * 16 + 2;
                sampleZ = chunkZ * 16 + 2;
                id = getBiomeAt(g, 1, sampleX, 0, sampleZ);
                if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                    goto L_not_viable;
            }
            viable = id; // biome for viablility, useful for further analysis
            goto L_viable;
        }
        else
        {   // In 1.18 village types are checked separtely...
            const int vv[] = { plains, desert, savanna, taiga, snowy_tundra };
            size_t i;
            for (i = 0; i < sizeof(vv)/sizeof(int); i++) {
                if (flags && flags != (uint32_t) vv[i])
                    continue;
                StructureVariant sv;
                getVariant(&sv, Village, g->mc, g->seed, x, z, vv[i]);
                sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
                sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
                sampleY = 319 >> 2;
                id = getBiomeAt(g, 0, sampleX, sampleY, sampleZ);
                if (id == vv[i] || (id == meadow && vv[i] == plains)) {
                    viable = vv[i];
                    goto L_viable;
                }
            }
            goto L_not_viable;
        }

    case Outpost:
    {
        if (g->mc <= MC_1_13)
            goto L_not_viable;
        uint64_t rng = g->seed;
        setAttemptSeed(&rng, chunkX, chunkZ);
        if (nextInt(&rng, 5) != 0)
            goto L_not_viable;
        // look for villages within 10 chunks
        StructureConfig vilconf;
        if (!getStructureConfig(Village, g->mc, &vilconf))
            goto L_not_viable;
        int cx0 = (chunkX-10), cx1 = (chunkX+10);
        int cz0 = (chunkZ-10), cz1 = (chunkZ+10);
        int rx0 = floordiv(cx0, vilconf.regionSize);
        int rx1 = floordiv(cx1, vilconf.regionSize);
        int rz0 = floordiv(cz0, vilconf.regionSize);
        int rz1 = floordiv(cz1, vilconf.regionSize);
        int rx, rz;
        for (rz = rz0; rz <= rz1; rz++)
        {
            for (rx = rx0; rx <= rx1; rx++)
            {
                Pos p = getFeaturePos(vilconf, g->seed, rx, rz);
                int cx = p.x >> 4, cz = p.z >> 4;
                if (cx >= cx0 && cx <= cx1 && cz >= cz0 && cz <= cz1)
                {
                    if (g->mc >= MC_1_16_1)
                        goto L_not_viable;
                    if (isViableStructurePos(Village, g, p.x, p.z, 0))
                        goto L_not_viable;
                }
            }
        }
        if (g->mc >= MC_1_18)
        {
            rng = chunkGenerateRnd(g->seed, chunkX, chunkZ);
            switch (nextInt(&rng, 4)) {
                case 0: sampleX = +15; sampleZ = +15; break;
                case 1: sampleX = -15; sampleZ = +15; break;
                case 2: sampleX = -15; sampleZ = -15; break;
                case 3: sampleX = +15; sampleZ = -15; break;
                default: return 0; // unreachable
            }
            sampleX = (chunkX * 32 + sampleX) / 2 >> 2;
            sampleZ = (chunkZ * 32 + sampleZ) / 2 >> 2;
        }
        else if (g->mc >= MC_1_16_1)
        {
            g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        else
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;
    }

    case Monument:
        if (g->mc <= MC_1_7)
            goto L_not_viable;
        else if (g->mc == MC_1_8)
        {   // In 1.8 monuments require only a single deep ocean block.
            id = getBiomeAt(g, 1, chunkX * 16 + 8, 0, chunkZ * 16 + 8);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        else if (g->mc <= MC_1_17)
        {   // Monuments require two viability checks with the ocean layer
            // branch => worth checking for potential deep ocean beforehand.
            g->entry = &g->ls.layers[L_SHORE_16];
            id = getBiomeAt(g, 0, chunkX, 0, chunkZ);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        sampleX = chunkX * 16 + 8;
        sampleZ = chunkZ * 16 + 8;
        if (g->mc >= MC_1_9 && g->mc <= MC_1_17)
        {   // check for deep ocean center
            if (!areBiomesViable(g, sampleX, 63, sampleZ, 16, g_monument_biomes2, 0, approx))
                goto L_not_viable;
        }
        else if (g->mc >= MC_1_18)
        {   // check is done at y level of ocean floor - approx. with y = 36
            id = getBiomeAt(g, 4, sampleX>>2, 36>>2, sampleZ>>2);
            if (!isDeepOcean(id))
                goto L_not_viable;
        }
        if (areBiomesViable(g, sampleX, 63, sampleZ, 29, g_monument_biomes1, 0, approx))
            goto L_viable;
        goto L_not_viable;

    case Mansion:
        if (g->mc <= MC_1_10)
            goto L_not_viable;
        if (g->mc <= MC_1_17)
        {
            sampleX = chunkX * 16 + 8;
            sampleZ = chunkZ * 16 + 8;
            uint64_t b = (1ULL << dark_forest);
            uint64_t m = (1ULL << (dark_forest_hills-128));
            if (!areBiomesViable(g, sampleX, 0, sampleZ, 32, b, m, approx))
                goto L_not_viable;
        }
        else
        {   // In 1.18 the generation gets the minimum surface height among the
            // four structure corners (note structure has rotation).
            // This minimum height has to be y >= 60. The biome check is done
            // at the center position at that height.
            // TODO: get surface height
            sampleX = chunkX * 16 + 7;
            sampleZ = chunkZ * 16 + 7;
            id = getBiomeAt(g, 4, sampleX>>2, 319>>2, sampleZ>>2);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
        }
        goto L_viable;

    case Ruined_Portal:
    case Ruined_Portal_N:
        if (g->mc <= MC_1_15)
            goto L_not_viable;
        goto L_viable;

    case Geode:
        if (g->mc <= MC_1_16)
            goto L_not_viable;
        goto L_viable;

    case Ancient_City:
        if (g->mc <= MC_1_18) goto L_not_viable;
        goto L_jigsaw;

    case Trial_Chambers:
        if (g->mc <= MC_1_20) goto L_not_viable;
L_jigsaw:
        {
            StructureVariant sv;
            getVariant(&sv, structureType, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx - 1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz - 1) / 2 >> 2;
            sampleY = sv.y >> 2;
            id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        }
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Mineshaft:
        goto L_viable;

    default:
        fprintf(stderr,
                "isViableStructurePos: bad structure type %d or dimension %d\n",
                structureType, g->dim);
        goto L_not_viable;
    }

L_viable:
    if (!viable)
        viable = 1;
L_not_viable:
    if (g->mc <= MC_1_17)
    {
        g->ls.layers[L_BIOME_256] = lbiome;
        g->ls.layers[L_SHORE_16] = lshore;
        g->entry = entry;
    }
    return viable;
}